

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

double __thiscall despot::POMDPX::Reward(POMDPX *this,State *state,ACT_TYPE a)

{
  int iVar1;
  
  if (this->is_small_ != false) {
    iVar1 = (*(this->super_MDP)._vptr_MDP[9])();
    return *(double *)
            (*(long *)&(this->rewards_).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar1].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + (long)a * 8);
  }
  __assert_fail("is_small_",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x18c,"virtual double despot::POMDPX::Reward(const State &, ACT_TYPE) const");
}

Assistant:

double POMDPX::Reward(const State& state, ACT_TYPE a) const {
	assert(is_small_);
	int s =GetIndex(&state);
	return rewards_[s][a];
}